

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnInitExprF64ConstExpr
          (BinaryReaderIR *this,Index index,uint64_t value)

{
  char *__s;
  Offset OVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  size_t sVar4;
  Expr *pEVar5;
  ExprList *pEVar6;
  Const local_80;
  char *pcStack_48;
  Location loc;
  
  loc.filename.size_._0_4_ = 0;
  loc.filename.size_._4_4_ = 0;
  loc.field_1.field_0.line = 0;
  pcStack_48 = (char *)0x0;
  loc.filename.data_._0_4_ = 0;
  loc.filename.data_._4_4_ = 0;
  __s = this->filename_;
  sVar4 = strlen(__s);
  loc.filename.data_._0_4_ = (undefined4)sVar4;
  loc.filename.data_._4_4_ = (undefined4)(sVar4 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.filename.size_._0_4_ = (undefined4)OVar1;
  loc.filename.size_._4_4_ = (undefined4)(OVar1 >> 0x20);
  pEVar2 = this->current_init_expr_;
  pcStack_48 = __s;
  Const::Const(&local_80,value,&pcStack_48);
  pEVar5 = (Expr *)operator_new(0x78);
  (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  pEVar5->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
  (pEVar5->loc).filename.data_ = pcStack_48;
  (pEVar5->loc).filename.size_ = CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
  (pEVar5->loc).field_1.field_1.offset =
       CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_);
  *(ulong *)((long)&(pEVar5->loc).field_1 + 8) =
       CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
  pEVar5->type_ = Const;
  pEVar5->_vptr_Expr = (_func_int **)&PTR__Expr_0155b9c8;
  *(undefined8 *)((long)&pEVar5[1].loc.field_1 + 8) = local_80.field_2._8_8_;
  pEVar5[1].loc.filename.size_ = local_80._32_8_;
  pEVar5[1].loc.field_1.field_1.offset = local_80.field_2.u64;
  pEVar5[1].super_intrusive_list_base<wabt::Expr>.prev_ =
       (Expr *)local_80.loc.field_1.field_1.offset;
  pEVar5[1].loc.filename.data_ = (char *)local_80.loc.field_1._8_8_;
  pEVar5[1]._vptr_Expr = (_func_int **)local_80.loc.filename.data_;
  pEVar5[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_80.loc.filename.size_;
  if (((pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar5->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    pEVar3 = pEVar2->last_;
    pEVar6 = pEVar2;
    if (pEVar3 != (Expr *)0x0) {
      (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
      pEVar6 = (ExprList *)&pEVar3->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar6->first_ = pEVar5;
    pEVar2->last_ = pEVar5;
    pEVar2->size_ = pEVar2->size_ + 1;
    return (Result)Ok;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

Result BinaryReaderIR::OnInitExprF64ConstExpr(Index index, uint64_t value) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<ConstExpr>(Const::F64(value, loc), loc));
  return Result::Ok;
}